

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O3

bool __thiscall Clasp::DefaultUnfoundedCheck::findSource(DefaultUnfoundedCheck *this,NodeId headId)

{
  AtomData AVar1;
  pointer pAVar2;
  pointer pAVar3;
  uint *puVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint *puVar11;
  pointer x;
  NodeId local_58;
  uint local_54;
  BodyPtr local_50;
  IdQueue *local_40;
  VarVec *local_38;
  
  local_58 = headId;
  pushUfs(this,headId);
  uVar6 = (this->ufs_).qFront;
  if (uVar6 == (this->ufs_).vec.ebo_.size) {
    (this->ufs_).qFront = 0;
  }
  else {
    local_40 = &this->ufs_;
    local_38 = &this->invalidQ_;
    uVar8 = 0;
    uVar7 = uVar6;
    do {
      (this->ufs_).qFront = uVar7 + 1;
      uVar6 = (this->ufs_).vec.ebo_.buf[uVar7];
      pAVar2 = (this->atoms_).ebo_.buf;
      local_58 = uVar6;
      if ((int)pAVar2[uVar6] < 0) {
        uVar8 = uVar8 + 1;
        pAVar2[uVar6] = (AtomData)((uint)pAVar2[uVar6] & 0xbfffffff);
      }
      else {
        pAVar3 = (this->graph_->atoms_).ebo_.buf;
        puVar4 = pAVar3[uVar6].super_Node.sep_;
        for (puVar11 = pAVar3[uVar6].super_Node.adj_; puVar11 != puVar4; puVar11 = puVar11 + 1) {
          local_50.id = *puVar11;
          local_50.node = (this->graph_->bodies_).ebo_.buf + local_50.id;
          uVar7 = ((local_50.node)->super_Node).lit.rep_;
          local_54 = uVar8;
          if ((byte)(*(byte *)((long)(this->solver_->assign_).assign_.ebo_.buf +
                              (ulong)(uVar7 & 0xfffffffc)) & 3) != (byte)(((uVar7 & 2) == 0) + 1U))
          {
            if (((*(uint *)&pAVar3[uVar6].super_Node.field_0x4 ^
                 *(uint *)&((local_50.node)->super_Node).field_0x4) & 0xfffffff) == 0) {
              bVar5 = isValidSource(this,&local_50);
              if (!bVar5) {
                addUnsourced(this,&local_50);
                goto LAB_00177609;
              }
            }
            pAVar2[uVar6].field_0x3 = pAVar2[uVar6].field_0x3 & 0xbf;
            setSource(this,local_58,&local_50);
            propagateSource(this);
            uVar8 = local_54 + 1;
            break;
          }
LAB_00177609:
          uVar8 = local_54;
        }
        if (-1 < (int)pAVar2[uVar6]) {
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (local_38,&local_58);
        }
      }
      uVar7 = (this->ufs_).qFront;
    } while (uVar7 != (this->ufs_).vec.ebo_.size);
    (this->ufs_).qFront = 0;
    if (uVar8 == 0) {
      uVar8 = 0;
      goto LAB_001776fa;
    }
    (this->ufs_).vec.ebo_.size = 0;
    uVar6 = 0;
    if (uVar7 != uVar8) {
      uVar9 = (ulong)(this->invalidQ_).ebo_.size;
      uVar8 = 0;
      uVar7 = uVar6;
      if (uVar9 != 0) {
        x = (this->invalidQ_).ebo_.buf;
        lVar10 = uVar9 << 2;
        do {
          pAVar2 = (this->atoms_).ebo_.buf;
          AVar1 = pAVar2[*x];
          pAVar2[*x] = (AtomData)((uint)AVar1 & 0xbfffffff | ~(uint)AVar1 >> 1 & 0x40000000);
          if (-1 < (int)AVar1) {
            bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&local_40->vec,x);
          }
          x = x + 1;
          lVar10 = lVar10 + -4;
        } while (lVar10 != 0);
        uVar7 = (this->ufs_).vec.ebo_.size;
        uVar8 = (this->ufs_).qFront;
      }
      goto LAB_001776fa;
    }
  }
  uVar8 = 0;
  uVar7 = uVar6;
LAB_001776fa:
  (this->invalidQ_).ebo_.size = 0;
  return uVar8 == uVar7;
}

Assistant:

bool DefaultUnfoundedCheck::findSource(NodeId headId) {
	assert(ufs_.empty() && invalidQ_.empty());
	const NodeId* bodyIt, *bodyEnd;
	uint32 newSource = 0;
	pushUfs(headId); // unfounded, unless we find a new source
	while (!ufs_.empty()) {
		headId         = ufs_.pop_ret(); // still marked and in vector!
		AtomData& head = atoms_[headId];
		if (!head.hasSource()) {
			const AtomNode& headNode = graph_->getAtom(headId);
			for (bodyIt = headNode.bodies_begin(), bodyEnd = headNode.bodies_end(); bodyIt != bodyEnd; ++bodyIt) {
				BodyPtr bodyNode(getBody(*bodyIt));
				if (!solver_->isFalse(bodyNode.node->lit)) {
					if (bodyNode.node->scc != headNode.scc || isValidSource(bodyNode)) {
						head.ufs = 0;               // found a new source,
						setSource(headId, bodyNode);// set the new source
						propagateSource();          // and propagate it forward
						++newSource;
						break;
					}
					else { addUnsourced(bodyNode); }
				}
			}
			if (!head.hasSource()) { // still no source - check again once we are done
				invalidQ_.push_back(headId);
			}
		}
		else {  // head has a source and is thus not unfounded
			++newSource;
			head.ufs = 0;
		}
	} // while unfounded_.emtpy() == false
	ufs_.rewind();
	if (newSource != 0) {
		// some atoms in unfounded_ have a new source
		// clear queue and check possible candidates for atoms that are still unfounded
		uint32 visited = sizeVec(ufs_.vec);
		ufs_.clear();
		if (visited != newSource) {
			// add elements that are still unfounded
			for (VarVec::iterator it = invalidQ_.begin(), end = invalidQ_.end(); it != end; ++it) {
				if ( (atoms_[*it].ufs = (1u - atoms_[*it].validS)) == 1 ) { ufs_.push(*it); }
			}
		}
	}
	invalidQ_.clear();
	return ufs_.empty();
}